

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undefined.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_UNDEFINED::Convert(_Type_UNDEFINED *this,Variable *object,Type *type)

{
  bool bVar1;
  String *this_00;
  bool *pbVar2;
  Object *pOVar3;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  Variable VVar5;
  Variable local_70 [2];
  String local_50;
  undefined1 local_29;
  Type *local_28;
  Type *type_local;
  Variable *object_local;
  _Type_UNDEFINED *this_local;
  Variable *res;
  uint *puVar4;
  
  local_28 = in_RCX;
  type_local = type;
  object_local = object;
  this_local = this;
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  if (bVar1) {
    local_29 = 0;
    pOVar3 = Variable::operator->((Variable *)type_local);
    Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    Variable::operator_cast_to_string(local_70);
    String::String(&local_50,(string *)local_70);
    pOVar3 = Variable::operator->((Variable *)this);
    this_00 = Object::GetData<LiteScript::String>(pOVar3);
    String::operator=(this_00,&local_50);
    String::~String(&local_50);
    std::__cxx11::string::~string((string *)local_70);
    puVar4 = extraout_RDX;
  }
  else {
    bVar1 = Type::operator==(local_28,(Type *)_type_boolean);
    if (bVar1) {
      pOVar3 = Variable::operator->((Variable *)type_local);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      pOVar3 = Variable::operator->((Variable *)this);
      pbVar2 = Object::GetData<bool>(pOVar3);
      *pbVar2 = false;
      puVar4 = extraout_RDX_00;
    }
    else {
      pOVar3 = Variable::operator->((Variable *)type_local);
      VVar5 = Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      puVar4 = VVar5.nb_ref;
    }
  }
  VVar5.nb_ref = puVar4;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::_Type_UNDEFINED::Convert(const Variable &object, const Type &type) const {
    if (type == Type::STRING) {
        Variable res = object->memory.Create(Type::STRING);
        res->GetData<String>() = String((std::string)(object));
        return res;
    }
    else if (type == Type::BOOLEAN) {
        Variable v = object->memory.Create(Type::BOOLEAN);
        v->GetData<bool>() = false;
        return v;
    }
    return object->memory.Create(Type::UNDEFINED);
}